

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGeneratorObjectStrings::Feed
          (cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  cmOutputConverter *this_00;
  long lVar1;
  long lVar2;
  string local_58;
  string local_38;
  string *local_18;
  string *obj_local;
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  this_00 = this->OutputConverter;
  local_18 = obj;
  obj_local = (string *)this;
  MaybeConvertToRelativePath(&local_58,this,obj);
  cmOutputConverter::ConvertToOutputFormat(&local_38,this_00,&local_58,RESPONSE);
  std::__cxx11::string::operator=((string *)&this->NextObject,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (this->LengthLimit != 0xffffffffffffffff) {
    lVar1 = std::__cxx11::string::length();
    lVar2 = std::__cxx11::string::length();
    if (this->LengthLimit < (ulong)(lVar1 + 1 + lVar2)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->Strings,&this->CurrentString);
      std::__cxx11::string::clear();
      this->Space = "";
    }
  }
  std::__cxx11::string::operator+=((string *)&this->CurrentString,this->Space);
  this->Space = " ";
  std::__cxx11::string::operator+=((string *)&this->CurrentString,(string *)&this->NextObject);
  return;
}

Assistant:

void Feed(std::string const& obj)
  {
    // Construct the name of the next object.
    this->NextObject = this->OutputConverter->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(obj), cmOutputConverter::RESPONSE);

    // Roll over to next string if the limit will be exceeded.
    if (this->LengthLimit != std::string::npos &&
        (this->CurrentString.length() + 1 + this->NextObject.length() >
         this->LengthLimit)) {
      this->Strings.push_back(this->CurrentString);
      this->CurrentString.clear();
      this->Space = "";
    }

    // Separate from previous object.
    this->CurrentString += this->Space;
    this->Space = " ";

    // Append this object.
    this->CurrentString += this->NextObject;
  }